

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ENDF.hpp
# Opt level: O1

void njoy::tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
               (double value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *it)

{
  uint *puVar1;
  bool bVar2;
  ostringstream *this;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ostringstream buffer;
  double local_210;
  double local_208;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  long local_1a8;
  long local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  this = (ostringstream *)&local_1a8;
  std::__cxx11::ostringstream::ostringstream(this);
  if (ABS(value) == INFINITY) {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffff4f | 0x80;
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 0xb;
    pcVar4 = "Inf";
    if (value < 0.0) {
      pcVar4 = "-Inf";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,pcVar4,(ulong)(value < 0.0) + 3);
    goto LAB_0013064e;
  }
  dVar12 = ABS(value);
  local_210 = 1.0;
  iVar3 = 0;
  iVar6 = 2;
  local_208 = value;
  if ((value != 0.0) || (NAN(value))) {
    dVar9 = log10(dVar12);
    dVar9 = floor(dVar9);
    iVar7 = (int)dVar9;
    iVar3 = 0;
    if (iVar7 != 0) {
      local_210 = pow(10.0,(double)iVar7);
      local_208 = value / local_210;
      iVar3 = -iVar7;
      if (0 < iVar7) {
        iVar3 = iVar7;
      }
      dVar9 = log10((double)iVar3);
      dVar9 = floor(dVar9);
      iVar6 = (int)dVar9 + 2;
      iVar3 = iVar7;
    }
  }
  iVar7 = 0xb - iVar6;
  uVar8 = 8 - iVar6;
  dVar9 = pow(10.0,(double)uVar8);
  dVar10 = round(local_208 * dVar9);
  dVar10 = dVar10 / dVar9;
  bVar2 = false;
  if ((0.1 <= dVar12) && (dVar12 < 10000000000.0)) {
    dVar12 = round(value * 100000000.0);
    if ((local_210 * dVar10 != dVar12 / 100000000.0) ||
       (NAN(local_210 * dVar10) || NAN(dVar12 / 100000000.0))) {
      dVar11 = pow(10.0,(double)iVar6);
      dVar12 = floor(ABS(local_208) * dVar9);
      dVar12 = (ABS(local_208) * dVar9 - dVar12) * dVar11;
      bVar2 = false;
      if (0.5 <= dVar12) {
        if (dVar12 <= dVar11 + -0.5) {
          iVar7 = 0xb;
          bVar2 = true;
          uVar8 = 0;
          if (iVar3 < 9) {
            uVar8 = 8 - iVar3;
            if (iVar3 < 1) {
              uVar8 = 8;
            }
          }
        }
        goto LAB_00130540;
      }
    }
    bVar2 = false;
  }
LAB_00130540:
  if ((!bVar2) && (local_208 = dVar10, 10.0 <= ABS(dVar10))) {
    iVar3 = iVar3 + 1;
    local_208 = *(double *)(&DAT_0019a0b0 + (ulong)(0.0 <= dVar10) * 8);
    if (iVar3 == 10) {
      iVar7 = iVar7 + -1;
      uVar8 = uVar8 - 1;
      iVar3 = 10;
    }
  }
  *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = (long)iVar7;
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18));
  *puVar1 = *puVar1 | 0x400;
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffff4f | 0x80;
  *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)(int)uVar8;
  if (bVar2) {
    if (uVar8 != 0) {
      std::ostream::_M_insert<double>(value);
      goto LAB_0013064e;
    }
    iVar3 = (int)value;
  }
  else {
    this = (ostringstream *)std::ostream::_M_insert<double>(local_208);
    *(uint *)((ostream *)this + *(long *)(*(long *)this + -0x18) + 0x18) =
         *(uint *)((ostream *)this + *(long *)(*(long *)this + -0x18) + 0x18) | 0x800;
  }
  std::ostream::operator<<(this,iVar3);
LAB_0013064e:
  std::__cxx11::stringbuf::str();
  if (local_1c0 != 0) {
    lVar5 = 0;
    do {
      std::__cxx11::string::push_back((char)it->container);
      lVar5 = lVar5 + 1;
    } while (local_1c0 != lVar5);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

static void write( Representation value, Iterator& it ) {

    const double absValue = std::abs( value );
    std::ostringstream buffer;

    if ( absValue == std::numeric_limits< Representation >::infinity() ) {

      buffer << std::right << std::setw( w );
      if ( value < 0 ) {

        buffer << "-Inf";
      }
      else {

        buffer << "Inf";
      }
    }
    else {

      // decompose value
      double significand = value;
      double tenToExponent = 1.;
      int exponent = 0;
      int expWidth = minExpWidth;
      if ( value != 0.0 ) {

        // log10(significand 10^exponent) = exponent + log10(significand) and
        // log10(significand) is within [0,1[ so that exponent is given by the
        // floor value
        exponent = static_cast< int >( std::floor( std::log10( absValue ) ) );

        if ( 0 != exponent ) {

          tenToExponent = std::pow( 10.0, exponent );
          significand /= tenToExponent;
          expWidth += static_cast< int >(
              std::floor( std::log10( std::abs( exponent ) ) ) );
        }
      }

      unsigned int width = w - expWidth;
      unsigned int precision = width - excluded;
      bool fixed = false;

      const double tenToPrecision = std::pow( 10.0, precision );
      const double rssignificand = std::round( significand * tenToPrecision )
                                   / tenToPrecision;

      // only check for fixed when the value is in [minFixed,maxFixed[
      if ( ( minFixed <= absValue ) and ( absValue < maxFixed ) ) {

        const double tenToFixedPrecision = std::pow( 10.0, precision + expWidth );
        const double rsreal = rssignificand * tenToExponent;
        const double rfreal = std::round( value * tenToFixedPrecision )
                              / tenToFixedPrecision;

        // only continue if fixed notation would not produce the same value
        if ( rsreal != rfreal ) {

          double max = std::pow( 10.0, expWidth );
          double remainder = std::abs( significand ) * tenToPrecision;
          remainder -= std::floor( remainder );
          remainder *= max;

          if ( ( roundoff <= remainder ) and ( remainder <= max - roundoff ) ) {

            fixed = true;
            precision += expWidth;
            width += expWidth;

            if ( exponent > static_cast< int >( precision ) ) {

              precision = 0;
            }
            else if ( 0 < exponent ) {

              precision -= exponent;
            }
          }
        }
      }

      // due to roundoff, we sometimes produce 10.+x values instead of 1.+(x+1)
      if ( not fixed ) {

        significand = rssignificand;
        if ( std::abs( rssignificand ) >= 10. ) {

          significand = significand >= 0. ? 1. : -1.;
          exponent += 1;
          if ( exponent == 10 ) {

            width -= 1;
            precision -= 1;
          }
        }
      }

      buffer << std::setw( width ) << std::fixed << std::showpoint
             << std::right << std::setprecision( precision );
      if ( fixed ) {

        if ( 0 == precision ) {

          buffer << static_cast< int >( value );
        }
        else {

          buffer << value;
        }
      }
      else {

        buffer << significand << std::showpos << exponent;
      }
    }

    for ( auto b : buffer.str() ) {

      *it++ = b;
    }
  }